

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

args * djb::microfacet::args::normalmap
                 (args *__return_storage_ptr__,vec3 *n,float_t a1,float_t a2,float_t phi_a)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar1 = n->z;
  if (0.0 < fVar1) {
    fVar2 = n->x;
    fVar3 = n->y;
    fVar4 = cosf(phi_a);
    fVar5 = sinf(phi_a);
    fVar8 = a1 * a1;
    fVar7 = a2 * a2;
    fVar9 = (fVar8 - fVar7) * ((fVar4 + fVar4) * fVar4 + -1.0);
    fVar6 = (fVar9 + fVar8 + fVar7) * 0.5;
    if (fVar6 < 0.0) {
      fVar6 = sqrtf(fVar6);
    }
    else {
      fVar6 = SQRT(fVar6);
    }
    fVar9 = ((fVar8 + fVar7) - fVar9) * 0.5;
    if (fVar9 < 0.0) {
      fVar9 = sqrtf(fVar9);
    }
    else {
      fVar9 = SQRT(fVar9);
    }
    args(__return_storage_ptr__,fVar6,fVar9,((fVar7 - fVar8) * fVar4 * fVar5) / (fVar6 * fVar9),
         -fVar2 / fVar1,-fVar3 / fVar1);
    return __return_storage_ptr__;
  }
  __assert_fail("n.z > 0 && \"invalid normal direction\"",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/demo-merl/dj_brdf.h"
                ,0x4d0,
                "static microfacet::args djb::microfacet::args::normalmap(const vec3 &, float_t, float_t, float_t)"
               );
}

Assistant:

microfacet::args
microfacet::args::normalmap(
	const vec3 &n, float_t a1, float_t a2, float_t phi_a
) {
	DJB_ASSERT(n.z > 0 && "invalid normal direction");
	float_t txn = -n.x / n.z;
	float_t tyn = -n.y / n.z;
	float_t ax, ay, cor;
	ellipse_to_p22args(a1, a2, phi_a, &ax, &ay, &cor);

	return microfacet::args::p22args(ax, ay, cor, txn, tyn);
}